

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_interp.c
# Opt level: O3

REF_STATUS ref_interp_process_agents(REF_INTERP ref_interp)

{
  REF_MPI ref_mpi;
  REF_AGENTS ref_agents;
  REF_CELL pRVar1;
  REF_ADJ pRVar2;
  REF_BOOL *pRVar3;
  REF_DBL *pRVar4;
  uint uVar5;
  int iVar6;
  REF_AGENT_STRUCT *pRVar7;
  ulong uVar8;
  long lVar9;
  REF_INT RVar10;
  undefined8 uVar11;
  REF_NODE pRVar12;
  char *pcVar13;
  undefined8 uVar14;
  long lVar15;
  long lVar16;
  long lVar17;
  REF_INT n_agents;
  REF_INT local_70;
  REF_INT local_6c;
  REF_NODE local_68;
  int local_5c;
  REF_INT *local_58;
  REF_INT *local_50;
  REF_INT *local_48;
  REF_CELL local_40;
  REF_NODE local_38;
  
  ref_mpi = ref_interp->ref_mpi;
  pRVar12 = ref_interp->from_grid->node;
  local_68 = ref_interp->to_grid->node;
  ref_agents = ref_interp->ref_agents;
  pRVar1 = (&ref_interp->from_tet)[ref_interp->from_grid->twod != 0];
  local_6c = ref_agents->n;
  uVar5 = ref_mpi_allsum(ref_mpi,&local_6c,1,1);
  if (uVar5 == 0) {
    local_50 = &ref_interp->walk_steps;
    local_48 = &ref_interp->n_terminated;
    local_58 = &ref_interp->n_walk;
    uVar8 = 0;
    local_40 = pRVar1;
    local_38 = pRVar12;
    do {
      if (local_6c < 1) {
        uVar5 = ref_mpi_allsum(ref_mpi,local_50,1,1);
        if (uVar5 == 0) {
          uVar5 = ref_mpi_allsum(ref_mpi,local_58,1,1);
          if (uVar5 == 0) {
            uVar5 = ref_mpi_allsum(ref_mpi,local_48,1,1);
            if (uVar5 == 0) {
              local_70 = 0;
              if ((long)local_68->max < 1) {
                return 0;
              }
              uVar8 = 0;
              while (((local_68->global[uVar8] < 0 ||
                      (local_68->ref_mpi->id != local_68->part[uVar8])) ||
                     (lVar15 = (long)ref_interp->agent_hired[uVar8], lVar15 == 0))) {
                uVar8 = uVar8 + 1;
                local_70 = (REF_INT)uVar8;
                if ((ulong)(long)local_68->max <= uVar8) {
                  return 0;
                }
              }
              pcVar13 = "should be done";
              uVar11 = 0x3bd;
              uVar14 = 0;
LAB_0016d514:
              printf("%s: %d: %s: %s\nexpected %ld was %ld\n",
                     "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_interp.c"
                     ,uVar11,"ref_interp_process_agents",pcVar13,uVar14,lVar15);
              return 1;
            }
            pcVar13 = "sum";
            uVar11 = 0x3b9;
          }
          else {
            pcVar13 = "sum";
            uVar11 = 0x3b7;
          }
        }
        else {
          pcVar13 = "sum";
          uVar11 = 0x3b6;
        }
        goto LAB_0016ce8e;
      }
      if ((ref_interp->instrument != 0) &&
         ((ref_interp->ref_mpi->id != 0 || (printf(" %2d sweep",uVar8), ref_interp->instrument != 0)
          ))) {
        ref_agents_population(ref_agents,"agent pop");
      }
      iVar6 = ref_agents->max;
      local_5c = (int)uVar8;
      if (0 < iVar6) {
        lVar16 = 0;
        lVar15 = 0;
        do {
          if ((*(int *)((long)ref_agents->agent->xyz + lVar16 + -0x30) == 1) &&
             (*(int *)((long)ref_agents->agent->xyz + lVar16 + -0x1c) == ref_mpi->id)) {
            uVar5 = ref_interp_walk_agent(ref_interp,(REF_INT)lVar15);
            if (uVar5 != 0) {
              pcVar13 = "walking";
              uVar11 = 0x367;
              goto LAB_0016ce8e;
            }
            iVar6 = ref_agents->max;
          }
          lVar15 = lVar15 + 1;
          lVar16 = lVar16 + 0x68;
        } while (lVar15 < iVar6);
      }
      uVar5 = ref_agents_migrate(ref_agents);
      if (uVar5 != 0) {
        pcVar13 = "send it";
        uVar11 = 0x36b;
        goto LAB_0016ce8e;
      }
      iVar6 = ref_agents->max;
      if (0 < iVar6) {
        pRVar7 = ref_agents->agent;
        lVar15 = 0;
        lVar16 = 0;
        do {
          if ((*(int *)((long)pRVar7->xyz + lVar15 + -0x30) == 3) &&
             (*(int *)((long)pRVar7->xyz + lVar15 + -0x1c) == ref_mpi->id)) {
            uVar5 = ref_node_local(local_38,*(REF_GLOB *)((long)pRVar7->xyz + lVar15 + -0x10),
                                   &local_70);
            if (uVar5 != 0) {
              pcVar13 = "localize";
              uVar11 = 0x371;
              goto LAB_0016ce8e;
            }
            pRVar7 = ref_agents->agent;
            *(undefined4 *)((long)pRVar7->xyz + lVar15 + -0x30) = 1;
            RVar10 = -1;
            if (((-1 < (long)local_70) && (pRVar2 = local_40->ref_adj, local_70 < pRVar2->nnode)) &&
               ((long)pRVar2->first[local_70] != -1)) {
              RVar10 = pRVar2->item[pRVar2->first[local_70]].ref;
            }
            *(REF_INT *)((long)pRVar7->xyz + lVar15 + -0x18) = RVar10;
            iVar6 = ref_agents->max;
          }
          lVar16 = lVar16 + 1;
          lVar15 = lVar15 + 0x68;
        } while (lVar16 < iVar6);
        if (0 < iVar6) {
          lVar16 = 0x20;
          lVar15 = 0;
          do {
            pRVar7 = ref_agents->agent;
            if ((*(int *)((long)pRVar7->xyz + lVar16 + -0x50) == 4) &&
               (*(int *)((long)pRVar7->xyz + lVar16 + -0x44) == ref_mpi->id)) {
              uVar5 = ref_node_local(local_68,*(REF_GLOB *)((long)pRVar7->xyz + lVar16 + -0x30),
                                     &local_70);
              if (uVar5 != 0) {
                pcVar13 = "localize";
                uVar11 = 0x37c;
                goto LAB_0016ce8e;
              }
              if ((ref_interp->cell[local_70] == -1) &&
                 (pRVar3 = ref_interp->agent_hired, pRVar3[local_70] == 0)) {
                pRVar7 = ref_interp->ref_agents->agent;
                *(undefined4 *)((long)pRVar7->xyz + lVar16 + -0x50) = 1;
                *(REF_INT *)((long)pRVar7->xyz + lVar16 + -0x40) = local_70;
                *(undefined8 *)((long)pRVar7->xyz + lVar16 + -0x30) = 0xffffffffffffffff;
                pRVar3[local_70] = 1;
              }
              else {
                uVar5 = ref_agents_remove(ref_interp->ref_agents,(REF_INT)lVar15);
                if (uVar5 != 0) {
                  pcVar13 = "already got one";
                  uVar11 = 0x37f;
                  goto LAB_0016ce8e;
                }
              }
            }
            lVar15 = lVar15 + 1;
            uVar8 = (ulong)ref_agents->max;
            lVar16 = lVar16 + 0x68;
          } while (lVar15 < (long)uVar8);
          if (0 < ref_agents->max) {
            lVar17 = 0;
            lVar16 = 0;
            pRVar12 = local_68;
            do {
              pRVar7 = ref_agents->agent;
              if (((*(uint *)((long)pRVar7->xyz + lVar17 + -0x30) | 4) == 6) &&
                 (*(int *)((long)pRVar7->xyz + lVar17 + -0x24) == ref_mpi->id)) {
                local_70 = *(int *)((long)pRVar7->xyz + lVar17 + -0x20);
                lVar9 = (long)local_70;
                if ((lVar9 < 0) || ((pRVar12->max <= local_70 || (pRVar12->global[lVar9] < 0)))) {
                  pcVar13 = "not valid";
                  uVar11 = 0x38e;
                  goto LAB_0016d6ab;
                }
                if (pRVar12->ref_mpi->id != pRVar12->part[lVar9]) {
                  pcVar13 = "ghost, not owned";
                  uVar11 = 0x38f;
                  goto LAB_0016d6ab;
                }
                lVar15 = (long)ref_interp->cell[lVar9];
                if (lVar15 != -1) {
                  uVar11 = 0x390;
                  goto LAB_0016d50d;
                }
                pRVar3 = ref_interp->agent_hired;
                if (pRVar3[lVar9] == 0) {
                  pcVar13 = "should have an agent";
                  uVar11 = 0x391;
                  goto LAB_0016d6ab;
                }
                if (*(int *)((long)pRVar7->xyz + lVar17 + -0x30) == 6) {
                  *(ulong *)local_48 =
                       CONCAT44(*(int *)((long)pRVar7->xyz + lVar17 + -8) + 1 +
                                (int)((ulong)*(undefined8 *)local_48 >> 0x20),
                                (int)*(undefined8 *)local_48 + 1);
                }
                pRVar3[lVar9] = 0;
                uVar5 = ref_agents_remove(ref_agents,(REF_INT)lVar16);
                if (uVar5 != 0) {
                  pcVar13 = "no longer needed";
                  uVar11 = 0x397;
                  goto LAB_0016ce8e;
                }
                uVar8 = (ulong)(uint)ref_agents->max;
                pRVar12 = local_68;
              }
              lVar16 = lVar16 + 1;
              lVar17 = lVar17 + 0x68;
            } while (lVar16 < (int)uVar8);
            if (0 < (int)uVar8) {
              lVar17 = 0x48;
              lVar16 = 0;
              do {
                pRVar7 = ref_agents->agent;
                if ((pRVar7[lVar16].mode == REF_AGENT_ENCLOSING) &&
                   (pRVar7[lVar16].home == ref_mpi->id)) {
                  local_70 = pRVar7[lVar16].node;
                  lVar9 = (long)local_70;
                  if ((lVar9 < 0) || ((local_68->max <= local_70 || (local_68->global[lVar9] < 0))))
                  {
                    pcVar13 = "not valid";
                    uVar11 = 0x39f;
LAB_0016d6ab:
                    printf("%s: %d: %s: %s\n",
                           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_interp.c"
                           ,uVar11,"ref_interp_process_agents",pcVar13);
                    return 1;
                  }
                  if (local_68->ref_mpi->id != local_68->part[lVar9]) {
                    pcVar13 = "ghost, not owned";
                    uVar11 = 0x3a0;
                    goto LAB_0016d6ab;
                  }
                  lVar15 = (long)ref_interp->cell[lVar9];
                  if (lVar15 != -1) {
                    uVar11 = 0x3a1;
LAB_0016d50d:
                    pcVar13 = "already found?";
                    uVar14 = 0xffffffffffffffff;
                    goto LAB_0016d514;
                  }
                  pRVar3 = ref_interp->agent_hired;
                  if (pRVar3[lVar9] == 0) {
                    pcVar13 = "should have an agent";
                    uVar11 = 0x3a2;
                    goto LAB_0016d6ab;
                  }
                  ref_interp->cell[lVar9] = pRVar7[lVar16].seed;
                  ref_interp->part[local_70] = pRVar7[lVar16].part;
                  pRVar4 = ref_interp->bary;
                  lVar15 = 0;
                  do {
                    pRVar4[(long)local_70 * 4 + lVar15] =
                         *(REF_DBL *)((long)pRVar7->xyz + lVar15 * 8 + lVar17 + -0x30);
                    lVar15 = lVar15 + 1;
                  } while (lVar15 != 4);
                  *local_50 = pRVar7[lVar16].step + *local_50 + 1;
                  *local_58 = *local_58 + 1;
                  pRVar3[local_70] = 0;
                  uVar5 = ref_agents_remove(ref_agents,(REF_INT)lVar16);
                  if (uVar5 != 0) {
                    pcVar13 = "no longer needed";
                    uVar11 = 0x3ac;
                    goto LAB_0016ce8e;
                  }
                  uVar5 = ref_interp_push_onto_queue(ref_interp,local_70);
                  if (uVar5 != 0) {
                    pcVar13 = "push";
                    uVar11 = 0x3ad;
                    goto LAB_0016ce8e;
                  }
                  uVar8 = (ulong)(uint)ref_agents->max;
                }
                lVar16 = lVar16 + 1;
                lVar17 = lVar17 + 0x68;
              } while (lVar16 < (int)uVar8);
            }
          }
        }
      }
      uVar8 = (ulong)(local_5c + 1);
      local_6c = ref_agents->n;
      uVar5 = ref_mpi_allsum(ref_mpi,&local_6c,1,1);
    } while (uVar5 == 0);
    pcVar13 = "sum";
    uVar11 = 0x3b2;
  }
  else {
    pcVar13 = "sum";
    uVar11 = 0x35c;
  }
LAB_0016ce8e:
  printf("%s: %d: %s: %d %s\n",
         "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_interp.c",uVar11,
         "ref_interp_process_agents",(ulong)uVar5,pcVar13);
  return uVar5;
}

Assistant:

REF_FCN static REF_STATUS ref_interp_process_agents(REF_INTERP ref_interp) {
  REF_NODE from_node = ref_grid_node(ref_interp_from_grid(ref_interp));
  REF_NODE to_node = ref_grid_node(ref_interp_to_grid(ref_interp));
  REF_CELL from_cell;
  REF_MPI ref_mpi = ref_interp_mpi(ref_interp);
  REF_AGENTS ref_agents = ref_interp->ref_agents;
  REF_INT i, id, node;
  REF_INT n_agents;
  REF_INT sweep = 0;

  if (ref_grid_twod(ref_interp_from_grid(ref_interp))) {
    from_cell = ref_interp_from_tri(ref_interp);
  } else {
    from_cell = ref_interp_from_tet(ref_interp);
  }

  n_agents = ref_agents_n(ref_agents);
  RSS(ref_mpi_allsum(ref_mpi, &n_agents, 1, REF_INT_TYPE), "sum");

  while (n_agents > 0) {
    if (ref_interp->instrument && ref_mpi_once(ref_interp->ref_mpi))
      printf(" %2d sweep", sweep);
    if (ref_interp->instrument) ref_agents_population(ref_agents, "agent pop");
    sweep++;

    each_active_ref_agent(ref_agents, id) {
      if (REF_AGENT_WALKING == ref_agent_mode(ref_agents, id) &&
          ref_agent_part(ref_agents, id) == ref_mpi_rank(ref_mpi)) {
        RSS(ref_interp_walk_agent(ref_interp, id), "walking");
      }
    }

    RSS(ref_agents_migrate(ref_agents), "send it");

    each_active_ref_agent(ref_agents, id) {
      if (REF_AGENT_HOP_PART == ref_agent_mode(ref_agents, id) &&
          ref_agent_part(ref_agents, id) == ref_mpi_rank(ref_mpi)) {
        RSS(ref_node_local(from_node, ref_agent_global(ref_agents, id), &node),
            "localize");
        ref_agent_mode(ref_agents, id) = REF_AGENT_WALKING;
        /* pick best from orbit? */
        ref_agent_seed(ref_agents, id) = ref_cell_first_with(from_cell, node);
      }
    }

    each_active_ref_agent(ref_agents, id) {
      if (REF_AGENT_SUGGESTION == ref_agent_mode(ref_agents, id) &&
          ref_agent_home(ref_agents, id) == ref_mpi_rank(ref_mpi)) {
        RSS(ref_node_local(to_node, ref_agent_global(ref_agents, id), &node),
            "localize");
        if (REF_EMPTY != ref_interp->cell[node] ||
            ref_interp->agent_hired[node]) {
          RSS(ref_agents_remove(ref_interp->ref_agents, id), "already got one");
        } else {
          ref_agent_mode(ref_interp->ref_agents, id) = REF_AGENT_WALKING;
          ref_agent_node(ref_interp->ref_agents, id) = node;
          ref_agent_global(ref_interp->ref_agents, id) = REF_EMPTY;
          ref_interp->agent_hired[node] = REF_TRUE;
        }
      }
    }

    each_active_ref_agent(ref_agents, id) {
      if ((REF_AGENT_AT_BOUNDARY == ref_agent_mode(ref_agents, id) ||
           REF_AGENT_TERMINATED == ref_agent_mode(ref_agents, id)) &&
          ref_agent_home(ref_agents, id) == ref_mpi_rank(ref_mpi)) {
        node = ref_agent_node(ref_agents, id);
        RAS(ref_node_valid(to_node, node), "not valid");
        RAS(ref_node_owned(to_node, node), "ghost, not owned");
        REIS(REF_EMPTY, ref_interp->cell[node], "already found?");
        RAS(ref_interp->agent_hired[node], "should have an agent");
        if (REF_AGENT_TERMINATED == ref_agent_mode(ref_agents, id)) {
          (ref_interp->walk_steps) += (ref_agent_step(ref_agents, id) + 1);
          (ref_interp->n_terminated)++;
        }
        ref_interp->agent_hired[node] = REF_FALSE; /* but no more */
        RSS(ref_agents_remove(ref_agents, id), "no longer needed");
      }
    }

    each_active_ref_agent(ref_agents, id) {
      if (REF_AGENT_ENCLOSING == ref_agent_mode(ref_agents, id) &&
          ref_agent_home(ref_agents, id) == ref_mpi_rank(ref_mpi)) {
        node = ref_agent_node(ref_agents, id);
        RAS(ref_node_valid(to_node, node), "not valid");
        RAS(ref_node_owned(to_node, node), "ghost, not owned");
        REIS(REF_EMPTY, ref_interp->cell[node], "already found?");
        RAS(ref_interp->agent_hired[node], "should have an agent");

        ref_interp->cell[node] = ref_agent_seed(ref_agents, id);
        ref_interp->part[node] = ref_agent_part(ref_agents, id);
        for (i = 0; i < 4; i++)
          ref_interp->bary[i + 4 * node] = ref_agent_bary(ref_agents, i, id);
        (ref_interp->walk_steps) += (ref_agent_step(ref_agents, id) + 1);
        (ref_interp->n_walk)++;

        ref_interp->agent_hired[node] = REF_FALSE; /* but no more */
        RSS(ref_agents_remove(ref_agents, id), "no longer needed");
        RSS(ref_interp_push_onto_queue(ref_interp, node), "push");
      }
    }

    n_agents = ref_agents_n(ref_agents);
    RSS(ref_mpi_allsum(ref_mpi, &n_agents, 1, REF_INT_TYPE), "sum");
  }

  RSS(ref_mpi_allsum(ref_mpi, &(ref_interp->walk_steps), 1, REF_INT_TYPE),
      "sum");
  RSS(ref_mpi_allsum(ref_mpi, &(ref_interp->n_walk), 1, REF_INT_TYPE), "sum");
  RSS(ref_mpi_allsum(ref_mpi, &(ref_interp->n_terminated), 1, REF_INT_TYPE),
      "sum");

  each_ref_node_valid_node(to_node, node) {
    if (ref_node_owned(to_node, node))
      REIS(REF_FALSE, ref_interp->agent_hired[node], "should be done");
  }

  return REF_SUCCESS;
}